

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

bool __thiscall XmlRpc::XmlRpcValue::timeFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  int iVar1;
  long lVar2;
  tm *ptVar3;
  bool bVar4;
  tm t;
  string stime;
  
  lVar2 = std::__cxx11::string::find((char)valueXml,0x3c);
  if (lVar2 == -1) {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&stime,(ulong)valueXml);
    iVar1 = __isoc99_sscanf(stime._M_dataplus._M_p,"%4d%2d%2dT%2d:%2d:%2d",&t.tm_year,&t.tm_mon,
                            &t.tm_mday,&t.tm_hour,&t.tm_min,&t);
    bVar4 = iVar1 == 6;
    if (bVar4) {
      t.tm_isdst = -1;
      this->_type = TypeDateTime;
      ptVar3 = (tm *)operator_new(0x38);
      ptVar3->tm_zone = t.tm_zone;
      *(ulong *)&ptVar3->tm_isdst = CONCAT44(t._36_4_,t.tm_isdst);
      ptVar3->tm_gmtoff = t.tm_gmtoff;
      ptVar3->tm_mon = t.tm_mon;
      ptVar3->tm_year = t.tm_year;
      ptVar3->tm_wday = t.tm_wday;
      ptVar3->tm_yday = t.tm_yday;
      ptVar3->tm_sec = t.tm_sec;
      ptVar3->tm_min = t.tm_min;
      ptVar3->tm_hour = t.tm_hour;
      ptVar3->tm_mday = t.tm_mday;
      (this->_value).asTime = ptVar3;
      *offset = *offset + (int)stime._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)stime._M_dataplus._M_p != &stime.field_2) {
      operator_delete(stime._M_dataplus._M_p,stime.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool XmlRpcValue::timeFromXml(std::string const& valueXml, int* offset)
  {
    size_t valueEnd = valueXml.find('<', *offset);
    if (valueEnd == std::string::npos)
      return false;     // No end tag;

    std::string stime = valueXml.substr(*offset, valueEnd-*offset);

    struct tm t;
#ifdef _MSC_VER
    if (sscanf_s(stime.c_str(),"%4d%2d%2dT%2d:%2d:%2d",&t.tm_year,&t.tm_mon,&t.tm_mday,&t.tm_hour,&t.tm_min,&t.tm_sec) != 6)
#else
    if (sscanf(stime.c_str(),"%4d%2d%2dT%2d:%2d:%2d",&t.tm_year,&t.tm_mon,&t.tm_mday,&t.tm_hour,&t.tm_min,&t.tm_sec) != 6)
#endif
      return false;

    t.tm_isdst = -1;
    _type = TypeDateTime;
    _value.asTime = new struct tm(t);
    *offset += int(stime.length());
    return true;
  }